

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph-opt.cpp
# Opt level: O2

string * getDefaultOutputFileName(string *__return_storage_ptr__,string *TgtLang)

{
  int iVar1;
  allocator *paVar2;
  char *pcVar3;
  allocator aStack_18;
  allocator local_17;
  allocator local_16;
  allocator local_15;
  allocator local_14;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  
  paVar2 = &aStack_18;
  pcVar3 = (TgtLang->_M_dataplus)._M_p;
  iVar1 = strcmp(pcVar3,"OPENMP");
  if (iVar1 == 0) {
    pcVar3 = "a.cpp";
    paVar2 = &local_11;
  }
  else {
    iVar1 = strcmp(pcVar3,"NUMPY");
    if (iVar1 == 0) {
      pcVar3 = "a.py";
      paVar2 = &local_12;
    }
    else {
      iVar1 = strcmp(pcVar3,"OPENCL");
      if (iVar1 == 0) {
        pcVar3 = "a.cl";
        paVar2 = &local_13;
      }
      else {
        iVar1 = strcmp(pcVar3,"CUDA");
        if (iVar1 == 0) {
          pcVar3 = "a.cu";
          paVar2 = &local_14;
        }
        else {
          iVar1 = strcmp(pcVar3,"BANG");
          if (iVar1 == 0) {
            pcVar3 = "a.mlu";
            paVar2 = &local_15;
          }
          else {
            iVar1 = strcmp(pcVar3,"CCE");
            if (iVar1 == 0) {
              pcVar3 = "a.cce";
              paVar2 = &local_16;
            }
            else {
              iVar1 = strcmp(pcVar3,"TPU");
              if (iVar1 == 0) {
                pcVar3 = "a.jl";
                paVar2 = &local_17;
              }
              else {
                pcVar3 = "a.cpp";
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,paVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string getDefaultOutputFileName(std::string &TgtLang) {
  if (!std::strcmp(TgtLang.c_str(), "OPENMP")) {
    return "a.cpp";
  } else if (!std::strcmp(TgtLang.c_str(), "NUMPY")) {
    return "a.py";
  } else if (!std::strcmp(TgtLang.c_str(), "OPENCL")) {
    return "a.cl";
  } else if (!std::strcmp(TgtLang.c_str(), "CUDA")) {
    return "a.cu";
  } else if (!std::strcmp(TgtLang.c_str(), "BANG")) {
    return "a.mlu";
  } else if (!std::strcmp(TgtLang.c_str(), "CCE")) {
    return "a.cce";
  } else if (!std::strcmp(TgtLang.c_str(), "TPU")) {
    return "a.jl";
  }
  return "a.cpp";
}